

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O2

void ParseVersion(string *version,int *major,int *minor)

{
  long lVar1;
  int iVar2;
  char *local_48 [4];
  
  lVar1 = std::__cxx11::string::find((char)version,0x2e);
  std::__cxx11::string::substr((ulong)local_48,(ulong)version);
  iVar2 = atoi(local_48[0]);
  *major = iVar2;
  std::__cxx11::string::~string((string *)local_48);
  *minor = 0;
  if (lVar1 != -1) {
    std::__cxx11::string::find((char)version,0x2e);
    std::__cxx11::string::substr((ulong)local_48,(ulong)version);
    iVar2 = atoi(local_48[0]);
    *minor = iVar2;
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void ParseVersion(const string& version, int* major, int* minor) {
  size_t end = version.find('.');
  *major = atoi(version.substr(0, end).c_str());
  *minor = 0;
  if (end != string::npos) {
    size_t start = end + 1;
    end = version.find('.', start);
    *minor = atoi(version.substr(start, end).c_str());
  }
}